

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O1

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>
::
transit_state_impl<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::idle,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::events::ready_for_query,afsm::actions::detail::guard_check<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def::transaction,afsm::test::events::ready_for_query,afsm::none>,afsm::actions::detail::action_invocation<afsm::test::transit_action,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def::transaction,afsm::test::connection_fsm_def::idle>,afsm::transitions::detail::state_exit<afsm::state_m___test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>>
          (state_transition_table<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::connection_fsm_def,std::atomic<unsigned_long>>
           *this,ready_for_query *event,
          inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
          *source,state<afsm::test::connection_fsm_def::idle,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
                  *target,undefined8 param_5)

{
  state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
  *psVar1;
  enclosing_fsm_type *peVar2;
  test_fsm_observer *ptVar3;
  inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
  local_130;
  
  psVar1 = *(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
             **)this;
  state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::connection_fsm_def::transaction,unsigned_long>
  ::exit<afsm::test::events::ready_for_query_const&>
            ((state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::connection_fsm_def::transaction,unsigned_long>
              *)&(source->
                 super_state_machine_base<afsm::test::connection_fsm_def::transaction,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
                 ).super_type.
                 super_state_machine_base_impl<afsm::test::connection_fsm_def::transaction,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
                 .
                 super_transition_container<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::test::connection_fsm_def::transaction,_unsigned_long>
             ,event);
  test::state_name::
  on_exit<afsm::test::events::ready_for_query_const&,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
            ((state_name *)source,event,psVar1);
  test::transit_action::operator()
            ((transit_action *)&local_130,event,
             *(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
               **)this,(transaction *)source,(idle *)target);
  test::state_name::
  on_enter<afsm::test::events::ready_for_query,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
            ((state_name *)target,event,
             *(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
               **)this);
  peVar2 = *(enclosing_fsm_type **)this;
  local_130.
  super_state_machine_base<afsm::test::connection_fsm_def::transaction,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
  .super_type.
  super_state_machine_base_impl<afsm::test::connection_fsm_def::transaction,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
  .super_state_base<afsm::test::connection_fsm_def::transaction>.super_type.super_transaction.
  super_state_machine<transaction>.
  super_state_def<afsm::test::connection_fsm_def::transaction,_afsm::def::tags::common_base<afsm::test::state_name>,_afsm::def::tags::basic_exception_safety>
  .super_common_base<afsm::test::state_name>.super_state_name._vptr_state_name =
       (type)&PTR__state_name_004401c0;
  local_130.
  super_state_machine_base<afsm::test::connection_fsm_def::transaction,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
  .super_type.
  super_state_machine_base_impl<afsm::test::connection_fsm_def::transaction,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
  .
  super_transition_container<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::test::connection_fsm_def::transaction,_unsigned_long>
  .
  super_transition_container<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::test::connection_fsm_def::transaction,_unsigned_long,_false>
  .transitions_.current_state_ = 0;
  local_130.
  super_state_machine_base<afsm::test::connection_fsm_def::transaction,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
  .super_type.
  super_state_machine_base_impl<afsm::test::connection_fsm_def::transaction,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
  .
  super_transition_container<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::test::connection_fsm_def::transaction,_unsigned_long>
  .
  super_transition_container<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::test::connection_fsm_def::transaction,_unsigned_long,_false>
  .transitions_.fsm_ = &local_130;
  afsm::detail::
  front_state_tuple<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_psst::meta::type_tuple<afsm::test::connection_fsm_def::transaction::starting,_afsm::test::connection_fsm_def::transaction::simple_query,_afsm::test::connection_fsm_def::transaction::extended_query,_afsm::test::connection_fsm_def::transaction::idle,_afsm::test::connection_fsm_def::transaction::tran_error,_afsm::test::connection_fsm_def::transaction::exiting>_>
  ::construct((inner_states_tuple *)
              ((long)&local_130.
                      super_state_machine_base<afsm::test::connection_fsm_def::transaction,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
                      .super_type.
                      super_state_machine_base_impl<afsm::test::connection_fsm_def::transaction,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
                      .
                      super_transition_container<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::test::connection_fsm_def::transaction,_unsigned_long>
                      .
                      super_transition_container<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>,_afsm::test::connection_fsm_def::transaction,_unsigned_long,_false>
              + 0x10),&local_130);
  local_130.
  super_state_machine_base<afsm::test::connection_fsm_def::transaction,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
  .super_type.
  super_state_machine_base_impl<afsm::test::connection_fsm_def::transaction,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
  .super_state_base<afsm::test::connection_fsm_def::transaction>.super_type.super_transaction.
  super_state_machine<transaction>.
  super_state_def<afsm::test::connection_fsm_def::transaction,_afsm::def::tags::common_base<afsm::test::state_name>,_afsm::def::tags::basic_exception_safety>
  .super_common_base<afsm::test::state_name>.super_state_name._vptr_state_name =
       (type)&PTR__state_machine_base_impl_004400c0;
  local_130.fsm_ = peVar2;
  inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>
  ::swap(source,&local_130);
  ptVar3 = (psVar1->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
           super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptVar3 != (test_fsm_observer *)0x0) {
    test::test_fsm_observer::
    state_cleared<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>
              (ptVar3,*(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                        **)this,source);
  }
  LOCK();
  *(undefined8 *)(this + 8) = param_5;
  UNLOCK();
  ptVar3 = (psVar1->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
           super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (ptVar3 != (test_fsm_observer *)0x0) {
    test::test_fsm_observer::
    state_changed<afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::state<afsm::test::connection_fsm_def::idle,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>,afsm::test::events::ready_for_query>
              (ptVar3,*(state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
                        **)this,source,target,event);
  }
  return process;
}

Assistant:

actions::event_process_result
    transit_state_impl(Event&& event, SourceState& source, TargetState& target,
            Guard guard, Action action, SourceExit exit,
            TargetEnter enter, SourceClear clear,
            ::std::size_t target_index,
            def::tags::basic_exception_safety const&)
    {
        if (guard(*fsm_, source, event)) {
            auto const& observer = root_machine(*fsm_);
            exit(source, ::std::forward<Event>(event), *fsm_);
            observer.state_exited(*fsm_, source, event);
            action(::std::forward<Event>(event), *fsm_, source, target);
            enter(target, ::std::forward<Event>(event), *fsm_);
            observer.state_entered(*fsm_, target, event);
            if (clear(*fsm_, source))
                observer.state_cleared(*fsm_, source);
            current_state_ = target_index;
            observer.state_changed(*fsm_, source, target, event);
            return actions::event_process_result::process;
        }
        return actions::event_process_result::refuse;
    }